

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Expr::Expr(Expr *this,ExprOp op,Var *left,Var *right)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  Var *pVVar1;
  bool bVar2;
  int iVar3;
  IRNodeKind IVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  VarType VVar9;
  undefined4 extraout_var;
  uint32_t *puVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  bool *pbVar12;
  size_type sVar13;
  const_reference pvVar14;
  VarException *pVVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar16;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffbbc;
  byte local_3d9;
  allocator<const_kratos::IRNode_*> local_2f1;
  Var *local_2f0;
  Var *local_2e8;
  Var **local_2e0;
  size_type local_2d8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2d0;
  undefined1 local_2b2 [34];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *left_size;
  Var *local_280;
  Var *local_278;
  Var **local_270;
  size_type local_268;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_260;
  int local_244;
  remove_reference_t<unsigned_int> local_240 [9];
  remove_reference_t<std::__cxx11::basic_string<char>_> local_21c;
  string local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  allocator<char> local_1a9;
  string local_1a8;
  Var *local_188;
  Var *right_local;
  Var *left_local;
  ExprOp op_local;
  Expr *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_160;
  basic_string_view<char> local_158;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_100;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  remove_reference_t<unsigned_int> *local_f0;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
  *vargs_1;
  char (*local_70) [40];
  char *local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
  *local_10;
  
  local_188 = right;
  right_local = left;
  left_local = (Var *)op;
  op_local = (ExprOp)this;
  iVar3 = (*(left->super_IRNode)._vptr_IRNode[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
  puVar10 = Var::var_width(right_local);
  uVar7 = *puVar10;
  pvVar11 = Var::size(right_local);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d8,pvVar11);
  pbVar12 = Var::is_signed(right_local);
  uVar17 = 1;
  aVar16._0_4_ = *pbVar12 & 1;
  aVar16._4_4_ = 0;
  pvVar11 = &local_1d8;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar3),&local_1a8,uVar7,pvVar11,
           SUB41(aVar16._0_4_,0),Expression);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00585550;
  this->op = (ExprOp)left_local;
  this->left = right_local;
  this->right = local_188;
  IVar4 = IRNode::ir_node_kind(&right_local->super_IRNode);
  if (IVar4 != VarKind) {
    __assert_fail("left->ir_node_kind() == IRNodeKind::VarKind",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/expr.cc",
                  0x2ec,"kratos::Expr::Expr(ExprOp, Var *, Var *)");
  }
  if ((local_188 != (Var *)0x0) &&
     (((left_local == (Var *)0xe || (left_local == (Var *)0xd)) || (left_local == (Var *)0xc)))) {
    uVar5 = (*(right_local->super_IRNode)._vptr_IRNode[7])();
    uVar6 = (*(local_188->super_IRNode)._vptr_IRNode[7])();
    if (uVar6 < uVar5) {
      uVar7 = (*(right_local->super_IRNode)._vptr_IRNode[7])();
      resize_var(this,uVar7,local_188,false);
      goto LAB_001f6f58;
    }
  }
  if (local_188 != (Var *)0x0) {
    iVar3 = (*(right_local->super_IRNode)._vptr_IRNode[7])();
    iVar8 = (*(local_188->super_IRNode)._vptr_IRNode[7])();
    pVVar1 = right_local;
    if (iVar3 != iVar8) {
      uVar7 = (*(local_188->super_IRNode)._vptr_IRNode[7])();
      pbVar12 = Var::is_signed(local_188);
      bVar2 = IterVar::safe_to_resize(pVVar1,uVar7,(bool)(*pbVar12 & 1));
      if (((bVar2) && (VVar9 = Var::type(local_188), VVar9 != ConstValue)) &&
         ((VVar9 = Var::type(local_188), VVar9 != Parameter &&
          (VVar9 = Var::type(local_188), VVar9 != Iter)))) {
        uVar7 = (*(local_188->super_IRNode)._vptr_IRNode[7])();
        resize_var(this,uVar7,right_local,true);
      }
      else {
        pVVar1 = local_188;
        uVar7 = (*(right_local->super_IRNode)._vptr_IRNode[7])();
        pbVar12 = Var::is_signed(right_local);
        bVar2 = IterVar::safe_to_resize(pVVar1,uVar7,(bool)(*pbVar12 & 1));
        if (bVar2) {
          uVar7 = (*(right_local->super_IRNode)._vptr_IRNode[7])();
          resize_var(this,uVar7,local_188,false);
        }
      }
      iVar3 = (*(this->left->super_IRNode)._vptr_IRNode[7])();
      iVar8 = (*(this->right->super_IRNode)._vptr_IRNode[7])();
      if (iVar3 != iVar8) {
        left_size._6_1_ = 1;
        pVVar15 = (VarException *)__cxa_allocate_exception(0x10);
        (*(right_local->super_IRNode)._vptr_IRNode[0x1f])(&local_21c.field_0x4);
        local_21c._0_4_ = (*(right_local->super_IRNode)._vptr_IRNode[7])();
        (*(local_188->super_IRNode)._vptr_IRNode[0x1f])(local_240);
        local_244 = (*(local_188->super_IRNode)._vptr_IRNode[7])();
        local_d0 = &local_1f8;
        local_d8 = "left ({0}) width ({1}) doesn\'t match with right ({2}) width ({3})";
        local_e0 = &local_21c.field_0x4;
        local_e8 = &local_21c;
        local_f0 = local_240;
        aVar16.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_244;
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)aVar16.values_;
        fmt::v7::
        make_args_checked<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int,char[66],char>
                  (&local_148,
                   (v7 *)"left ({0}) width ({1}) doesn\'t match with right ({2}) width ({3})",
                   (char (*) [66])local_e0,local_e8,local_f0,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)aVar16.values_,
                   (remove_reference_t<unsigned_int> *)CONCAT44(in_stack_fffffffffffffbbc,uVar17));
        local_100 = &local_148;
        local_158 = fmt::v7::to_string_view<char,_0>(local_d8);
        local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&this_local;
        local_58 = local_100;
        local_48 = local_100;
        local_38 = local_100;
        local_40 = local_50;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_50,0x2d2d,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_100);
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = aVar16.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_160.values_;
        format_str.size_ = (size_t)this_local;
        format_str.data_ = (char *)local_158.size_;
        fmt::v7::detail::vformat_abi_cxx11_(&local_1f8,(detail *)local_158.data_,format_str,args);
        local_280 = right_local;
        local_278 = local_188;
        local_270 = &local_280;
        local_268 = 2;
        std::allocator<const_kratos::IRNode_*>::allocator
                  ((allocator<const_kratos::IRNode_*> *)((long)&left_size + 7));
        __l_00._M_len = local_268;
        __l_00._M_array = (iterator)local_270;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_260,__l_00,(allocator<const_kratos::IRNode_*> *)((long)&left_size + 7));
        VarException::VarException(pVVar15,&local_1f8,&local_260);
        left_size._6_1_ = 0;
        __cxa_throw(pVVar15,&VarException::typeinfo,VarException::~VarException);
      }
    }
  }
LAB_001f6f58:
  bVar2 = is_relational_op((ExprOp)left_local);
  if ((bVar2) || (bVar2 = is_reduction_op((ExprOp)left_local), bVar2)) {
    (this->super_Var).var_width_ = 1;
  }
  else {
    puVar10 = Var::var_width(right_local);
    (this->super_Var).var_width_ = *puVar10;
  }
  if (local_188 == (Var *)0x0) {
    pbVar12 = Var::is_signed(right_local);
    (this->super_Var).is_signed_ = (bool)(*pbVar12 & 1);
  }
  else {
    pbVar12 = Var::is_signed(right_local);
    local_3d9 = 0;
    if ((*pbVar12 & 1U) != 0) {
      pbVar12 = Var::is_signed(local_188);
      local_3d9 = *pbVar12;
    }
    (this->super_Var).is_signed_ = (bool)(local_3d9 & 1);
  }
  (this->super_Var).type_ = Expression;
  set_parent(this);
  local_290 = Var::size(right_local);
  if (local_188 != (Var *)0x0) {
    uVar5 = (*(right_local->super_IRNode)._vptr_IRNode[0x18])();
    iVar3 = (*(local_188->super_IRNode)._vptr_IRNode[0x18])();
    if (((uVar5 & 1) != (uint)((byte)iVar3 & 1)) &&
       ((sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_290),
        1 < sVar13 ||
        (pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(local_290),
        1 < *pvVar14)))) {
      pVVar15 = (VarException *)__cxa_allocate_exception(0x10);
      iVar3 = (*(right_local->super_IRNode)._vptr_IRNode[0x18])();
      local_2b2[1] = (byte)iVar3 & 1;
      iVar3 = (*(local_188->super_IRNode)._vptr_IRNode[0x18])();
      local_2b2[0] = (byte)iVar3 & 1;
      local_60 = local_2b2 + 2;
      local_68 = "left is packed ({0}) but right is ({1})";
      local_70 = (char (*) [40])(local_2b2 + 1);
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_bool,_bool>
                 *)local_2b2;
      fmt::v7::make_args_checked<bool,bool,char[40],char>
                (&local_a8,(v7 *)"left is packed ({0}) but right is ({1})",local_70,
                 (remove_reference_t<bool> *)vargs_1,(remove_reference_t<bool> *)pvVar11);
      local_80 = &local_a8;
      local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
      local_28 = &local_c8;
      local_30 = local_80;
      local_20 = local_80;
      local_10 = local_80;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0x77,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_80);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar16.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_c8.field_1.values_;
      format_str_00.size_ = local_c8.desc_;
      format_str_00.data_ = (char *)local_b8.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)(local_2b2 + 2),(detail *)local_b8.data_,format_str_00,args_00);
      local_2f0 = right_local;
      local_2e8 = local_188;
      local_2e0 = &local_2f0;
      local_2d8 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_2f1);
      __l._M_len = local_2d8;
      __l._M_array = (iterator)local_2e0;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_2d0,__l,&local_2f1);
      VarException::VarException(pVVar15,(string *)(local_2b2 + 2),&local_2d0);
      __cxa_throw(pVVar15,&VarException::typeinfo,VarException::~VarException);
    }
  }
  iVar3 = (*(right_local->super_IRNode)._vptr_IRNode[0x18])();
  (this->super_Var).is_packed_ = (bool)((byte)iVar3 & 1);
  return;
}

Assistant:

Expr::Expr(ExprOp op, Var *left, Var *right)
    : Var(left->generator(), "", left->var_width(), left->size(), left->is_signed(),
          VarType::Expression),
      op(op),
      left(left),
      right(right) {
    assert(left->ir_node_kind() == IRNodeKind::VarKind);
    // notice that we allow shifting to have different size
    if (right &&
        (op == ExprOp::ShiftLeft || op == ExprOp::SignedShiftRight ||
         op == ExprOp::LogicalShiftRight) &&
        (left->width() > right->width())) {
        // resize right
        resize_var(this, left->width(), right, false);
    } else if (right != nullptr && left->width() != right->width()) {
        // see if we can resize
        if (IterVar::safe_to_resize(left, right->width(), right->is_signed()) &&
            (right->type() != VarType::ConstValue && right->type() != VarType::Parameter &&
             right->type() != VarType::Iter)) {
            resize_var(this, right->width(), left, true);
        } else if (IterVar::safe_to_resize(right, left->width(), left->is_signed())) {
            resize_var(this, left->width(), right, false);
        }
        if (this->left->width() != this->right->width())
            throw VarException(
                ::format("left ({0}) width ({1}) doesn't match with right ({2}) width ({3})",
                         left->to_string(), left->width(), right->to_string(), right->width()),
                {left, right});
    }

    // if it's a predicate/relational op, the width is one
    if (is_relational_op(op) || is_reduction_op(op))
        var_width_ = 1;
    else
        var_width_ = left->var_width();

    if (right != nullptr)
        is_signed_ = left->is_signed() && right->is_signed();
    else
        is_signed_ = left->is_signed();
    type_ = VarType::Expression;
    set_parent();

    // both of them has to be packed array
    auto const &left_size = left->size();
    if (right != nullptr && left->is_packed() != right->is_packed() &&
        (left_size.size() > 1 || left_size.front() > 1))
        throw VarException(::format("left is packed ({0}) but right is ({1})", left->is_packed(),
                                    right->is_packed()),
                           {left, right});
    is_packed_ = left->is_packed();
}